

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorGraph.hpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkValidatorGraph::insertNode(NeuralNetworkValidatorGraph *this,LayerNode *node)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  *this_00;
  pointer *pppLVar1;
  pointer pbVar2;
  iterator iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  *pmVar4;
  LayerNode *pLVar5;
  iterator iVar6;
  mapped_type *ppLVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar8;
  LayerNode *producingNode;
  LayerNode *local_48;
  LayerNode *local_40;
  NeuralNetworkValidatorGraph *local_38;
  
  pbVar8 = (node->inputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (node->inputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = node;
  if (pbVar8 != pbVar2) {
    this_00 = &this->blobNameToProducingNode;
    pmVar4 = &this->blobNameToProducingNode;
    local_38 = this;
    do {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
              ::find(&this_00->_M_t,pbVar8);
      if ((_Rb_tree_header *)iVar6._M_node != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
        ppLVar7 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                  ::at(this_00,pbVar8);
        local_40 = *ppLVar7;
        iVar3._M_current =
             (local_48->parents).
             super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_48->parents).
            super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>>::
          _M_realloc_insert<CoreML::LayerNode*const&>
                    ((vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>> *)local_48,iVar3
                     ,&local_40);
        }
        else {
          *iVar3._M_current = local_40;
          pppLVar1 = &(local_48->parents).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
        iVar3._M_current =
             (local_40->children).
             super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (local_40->children).
            super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>>::
          _M_realloc_insert<CoreML::LayerNode*const&>
                    ((vector<CoreML::LayerNode*,std::allocator<CoreML::LayerNode*>> *)
                     &local_40->children,iVar3,&local_48);
        }
        else {
          *iVar3._M_current = local_48;
          pppLVar1 = &(local_40->children).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppLVar1 = *pppLVar1 + 1;
        }
      }
      pbVar8 = pbVar8 + 1;
      this = local_38;
    } while (pbVar8 != pbVar2);
  }
  pbVar8 = (local_48->outputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_48->outputNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar2) {
    do {
      pLVar5 = local_48;
      ppLVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
                ::operator[](&this->blobNameToProducingNode,pbVar8);
      *ppLVar7 = pLVar5;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != pbVar2);
  }
  pLVar5 = local_48;
  ppLVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
            ::operator[](&this->nodeNameToNode,&local_48->name);
  *ppLVar7 = pLVar5;
  return;
}

Assistant:

void insertNode(LayerNode *node)
    {
        for (const auto& name: node->inputNames) {
            if (blobNameToProducingNode.find(name) != blobNameToProducingNode.end()) {
                LayerNode *producingNode = blobNameToProducingNode.at(name);
                node->parents.push_back(producingNode);
                producingNode->children.push_back(node);
            }
        }
        for (const auto& name: node->outputNames) {
            blobNameToProducingNode[name] = node;
        }
        nodeNameToNode[node->name] = node;
    }